

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O3

void __thiscall
OpenMD::FCCOfR::collectHistogram
          (FCCOfR *this,vector<double,_std::allocator<double>_> param_1,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *what,
          RealType distCOM)

{
  int *piVar1;
  int iVar2;
  long *in_RDX;
  
  if (distCOM < (this->super_BOPofR).len_) {
    iVar2 = (int)(distCOM / (this->super_BOPofR).deltaR_);
    piVar1 = (this->super_BOPofR).RCount_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar2;
    *piVar1 = *piVar1 + 1;
    if (*(double *)(*in_RDX + 0x40) <= -0.12 && *(double *)(*in_RDX + 0x40) != -0.12) {
      piVar1 = (this->super_BOPofR).WofR_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar2;
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void FCCOfR::collectHistogram(std::vector<RealType>,
                                std::vector<ComplexType> what,
                                RealType distCOM) {
    if (distCOM < len_) {
      // Figure out where this distance goes...
      int whichBin = int(distCOM / deltaR_);
      RCount_[whichBin]++;

      if (real(what[4]) < -0.12) { WofR_[whichBin]++; }
    }
  }